

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_pack_16_mm_ay7(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint src;
  uint ea_src;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] - 2;
    uVar1 = m68ki_read_8_fc(m68ki_cpu.dar[0xf],m68ki_cpu.s_flag | m68ki_address_space);
    m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] - 2;
    uVar2 = m68ki_read_8_fc(m68ki_cpu.dar[0xf],m68ki_cpu.s_flag | m68ki_address_space);
    uVar3 = m68ki_read_imm_16();
    uVar4 = (uVar1 << 8 | uVar2) + uVar3;
    uVar5 = (ulong)(m68ki_cpu.ir >> 9 & 7);
    uVar1 = m68ki_cpu.dar[uVar5 + 8] - 1;
    m68ki_cpu.dar[uVar5 + 8] = uVar1;
    m68ki_write_8_fc(uVar1,m68ki_cpu.s_flag | 1,uVar4 >> 4 & 0xf0 | uVar4 & 0xf);
  }
  return;
}

Assistant:

static void m68k_op_pack_16_mm_ay7(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		/* Note: AX and AY are reversed in Motorola's docs */
		uint ea_src = EA_A7_PD_8();
		uint src = m68ki_read_8(ea_src);
		ea_src = EA_A7_PD_8();
		src = ((src << 8) | m68ki_read_8(ea_src)) + OPER_I_16();

		m68ki_write_8(EA_AX_PD_8(), ((src >> 4) & 0x00f0) | (src & 0x000f));
		return;
	}
	m68ki_exception_illegal();
}